

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::CloneVertexInterface
          (ProgramInterface *this,VaryingPassthrough *varying_passthrough)

{
  Variable *pVVar1;
  GLchar *pGVar2;
  bool bVar3;
  pointer ppVVar4;
  ulong uVar5;
  GLchar binding [16];
  GLchar aGStack_48 [24];
  
  ppVVar4 = (this->m_vertex).m_outputs.
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertex).m_outputs.
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVVar4) {
    uVar5 = 0;
    do {
      pVVar1 = ppVVar4[uVar5];
      pGVar2 = GetStagePrefix::lut[1][pVVar1->m_storage];
      cloneVariableForStage(this,pVVar1,TESS_CTRL,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,TESS_EVAL,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,GEOMETRY,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,FRAGMENT,pGVar2,varying_passthrough);
      uVar5 = uVar5 + 1;
      ppVVar4 = (this->m_vertex).m_outputs.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->m_vertex).m_outputs.
                                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >> 3))
    ;
  }
  ppVVar4 = (this->m_vertex).m_uniforms.
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertex).m_uniforms.
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVVar4) {
    uVar5 = 0;
    do {
      pVVar1 = ppVVar4[uVar5];
      pGVar2 = GetStagePrefix::lut[1][pVVar1->m_storage];
      cloneVariableForStage(this,pVVar1,COMPUTE,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,TESS_CTRL,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,TESS_EVAL,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,GEOMETRY,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,FRAGMENT,pGVar2,varying_passthrough);
      bVar3 = Variable::IsBlock(pVVar1);
      if (bVar3) {
        sprintf(aGStack_48,"%d",1);
        replaceAllTokens("BINDING",aGStack_48,&(pVVar1->m_descriptor).m_qualifiers);
      }
      uVar5 = uVar5 + 1;
      ppVVar4 = (this->m_vertex).m_uniforms.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->m_vertex).m_uniforms.
                                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >> 3))
    ;
  }
  ppVVar4 = (this->m_vertex).m_ssb_blocks.
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertex).m_ssb_blocks.
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVVar4) {
    uVar5 = 0;
    do {
      pVVar1 = ppVVar4[uVar5];
      pGVar2 = GetStagePrefix::lut[1][pVVar1->m_storage];
      cloneVariableForStage(this,pVVar1,COMPUTE,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,TESS_CTRL,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,TESS_EVAL,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,GEOMETRY,pGVar2,varying_passthrough);
      cloneVariableForStage(this,pVVar1,FRAGMENT,pGVar2,varying_passthrough);
      bVar3 = Variable::IsBlock(pVVar1);
      if (bVar3) {
        sprintf(aGStack_48,"%d",1);
        replaceAllTokens("BINDING",aGStack_48,&(pVVar1->m_descriptor).m_qualifiers);
      }
      uVar5 = uVar5 + 1;
      ppVVar4 = (this->m_vertex).m_ssb_blocks.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->m_vertex).m_ssb_blocks.
                                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >> 3))
    ;
  }
  std::__cxx11::string::_M_assign((string *)&this->m_compute);
  std::__cxx11::string::_M_assign((string *)&this->m_fragment);
  std::__cxx11::string::_M_assign((string *)&this->m_geometry);
  std::__cxx11::string::_M_assign((string *)&this->m_tess_ctrl);
  std::__cxx11::string::_M_assign((string *)&this->m_tess_eval);
  return;
}

Assistant:

void ProgramInterface::CloneVertexInterface(VaryingPassthrough& varying_passthrough)
{
	/* VS outputs >> TCS inputs >> TCS outputs >> ..  >> FS inputs */
	for (size_t i = 0; i < m_vertex.m_outputs.size(); ++i)
	{
		const Variable& vs_var = *m_vertex.m_outputs[i];
		const GLchar*   prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);
	}

	/* Copy uniforms from VS to other stages */
	for (size_t i = 0; i < m_vertex.m_uniforms.size(); ++i)
	{
		Variable&	 vs_var = *m_vertex.m_uniforms[i];
		const GLchar* prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::COMPUTE, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);

		/* Uniform blocks needs unique binding */
		if (true == vs_var.IsBlock())
		{
			replaceBinding(vs_var, Shader::VERTEX);
		}
	}

	/* Copy SSBs from VS to other stages */
	for (size_t i = 0; i < m_vertex.m_ssb_blocks.size(); ++i)
	{
		Variable&	 vs_var = *m_vertex.m_ssb_blocks[i];
		const GLchar* prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::COMPUTE, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);

		/* SSBs blocks needs unique binding */
		if (true == vs_var.IsBlock())
		{
			replaceBinding(vs_var, Shader::VERTEX);
		}
	}

	m_compute.m_globals   = m_vertex.m_globals;
	m_fragment.m_globals  = m_vertex.m_globals;
	m_geometry.m_globals  = m_vertex.m_globals;
	m_tess_ctrl.m_globals = m_vertex.m_globals;
	m_tess_eval.m_globals = m_vertex.m_globals;
}